

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall OpenMD::HBondJumpZ::findHBonds(HBondJumpZ *this,int frame)

{
  int hIndex;
  long lVar1;
  bool bVar2;
  Molecule *pMVar3;
  HBondDonor *pHVar4;
  Molecule *pMVar5;
  pointer ppAVar6;
  pointer ppHVar7;
  Atom *pAVar8;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Vector3d pos;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Mat3x3d hmat;
  pointer local_1d0;
  MoleculeIterator local_1c8;
  double local_1c0;
  long local_1b8;
  MoleculeIterator local_1b0;
  Atom *local_1a8;
  Molecule *local_1a0;
  Molecule *local_198;
  Molecule *local_190;
  long local_188;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Mat3x3d local_108;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_1b0._M_node = (_Base_ptr)0x0;
  local_1c8._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_120);
  Vector<double,_3U>::Vector(&local_168);
  Vector<double,_3U>::Vector(&local_138);
  Vector<double,_3U>::Vector(&local_180);
  Snapshot::getHmat(&local_108,(this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_);
  local_1c0 = *(double *)
               ((long)local_108.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
               + (ulong)(uint)this->axis_ * 0x20);
  pMVar3 = SimInfo::beginMolecule
                     ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1b0);
  while (pMVar3 != (Molecule *)0x0) {
    ppHVar7 = (pMVar3->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppHVar7 !=
        (pMVar3->hBondDonors_).
        super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001356b6;
    pHVar4 = (HBondDonor *)0x0;
    while (pHVar4 != (HBondDonor *)0x0) {
      (*(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
        _vptr_DynamicProperty[0x14])
                (this,(ulong)(uint)frame,
                 (ulong)(uint)(pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_);
      ppHVar7 = ppHVar7 + 1;
      pHVar4 = (HBondDonor *)0x0;
      if (ppHVar7 !=
          (pMVar3->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001356b6:
        pHVar4 = *ppHVar7;
      }
    }
    pMVar3 = SimInfo::nextMolecule
                       ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1b0);
  }
  local_1c0 = local_1c0 * 0.5;
  pMVar3 = SimInfo::beginMolecule
                     ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1b0);
  local_188 = (long)frame;
  while (pMVar3 != (Molecule *)0x0) {
    local_1d0 = (pointer)(pMVar3->hBondDonors_).
                         super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    local_190 = pMVar3;
    if (local_1d0 !=
        (pointer)(pMVar3->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013598f;
    pHVar4 = (HBondDonor *)0x0;
    while (pHVar4 != (HBondDonor *)0x0) {
      local_1a0 = (Molecule *)(long)(pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_;
      local_1a8 = (Atom *)(local_188 * 0x18);
      local_1b8 = (long)*(int *)(*(long *)((long)&(local_1a8->super_StuntDouble)._vptr_StuntDouble +
                                          (long)(this->super_HBondJump).GIDtoH_.
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) +
                                (long)local_1a0 * 4);
      StuntDouble::getPos((Vector3d *)&local_150,&pHVar4->donorAtom->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_120,&local_150);
      StuntDouble::getPos((Vector3d *)&local_150,&pHVar4->donatedHydrogen->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_168,&local_150);
      local_1c8._M_node = local_1b0._M_node;
      pMVar5 = SimInfo::beginMolecule
                         ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1c8);
      while (pMVar5 != (Molecule *)0x0) {
        ppAVar6 = (pMVar5->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_198 = pMVar5;
        if (ppAVar6 !=
            (pMVar5->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00135945;
        pAVar8 = (Atom *)0x0;
        while (pAVar8 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_150,&pAVar8->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_138,&local_150);
          Vector<double,_3U>::Vector(&local_48,&local_120);
          Vector<double,_3U>::Vector(&local_60,&local_168);
          Vector<double,_3U>::Vector(&local_78,&local_138);
          bVar2 = HBondJump::isHBond(&this->super_HBondJump,(Vector3d *)&local_48,
                                     (Vector3d *)&local_60,(Vector3d *)&local_78);
          if (bVar2) {
            HBondJump::registerHydrogenBond
                      (&this->super_HBondJump,frame,(int)local_1b8,(int)local_1a0,
                       (pAVar8->super_StuntDouble).globalIndex_);
            Vector<double,_3U>::operator=(&local_180,&local_168);
            if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
              Snapshot::wrapVector
                        ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                         (Vector3d *)&local_180);
            }
            *(int *)(*(long *)((long)&(local_1a8->super_StuntDouble)._vptr_StuntDouble +
                              (long)(this->zbin_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + local_1b8 * 4) =
                 (int)(((local_180.data_[(uint)this->axis_] + local_1c0) * (double)this->nZBins_) /
                      *(double *)
                       ((long)local_108.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_ +
                       (ulong)(uint)this->axis_ * 0x20));
          }
          ppAVar6 = ppAVar6 + 1;
          pAVar8 = (Atom *)0x0;
          if (ppAVar6 !=
              (local_198->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00135945:
            pAVar8 = *ppAVar6;
          }
        }
        pMVar5 = SimInfo::nextMolecule
                           ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1c8);
        pMVar3 = local_190;
      }
      local_1d0 = local_1d0 + 1;
      pHVar4 = (HBondDonor *)0x0;
      if (local_1d0 !=
          (pointer)(pMVar3->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013598f:
        pHVar4 = (HBondDonor *)*local_1d0;
      }
    }
    local_1d0 = (pMVar3->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_1d0 !=
        (pMVar3->hBondAcceptors_).
        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00135c13;
    pAVar8 = (Atom *)0x0;
    while (pAVar8 != (Atom *)0x0) {
      local_1a8 = pAVar8;
      StuntDouble::getPos((Vector3d *)&local_150,&pAVar8->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_138,&local_150);
      local_1c8._M_node = local_1b0._M_node;
      pMVar5 = SimInfo::beginMolecule
                         ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1c8);
      while (pMVar5 != (Molecule *)0x0) {
        ppHVar7 = (pMVar5->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1a0 = pMVar5;
        if (ppHVar7 !=
            (pMVar5->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00135bca;
        pHVar4 = (HBondDonor *)0x0;
        while (pHVar4 != (HBondDonor *)0x0) {
          hIndex = (pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_;
          local_198 = (Molecule *)(local_188 * 0x18);
          local_1b8 = (long)*(int *)(*(long *)((long)&local_198->_vptr_Molecule +
                                              (long)(this->super_HBondJump).GIDtoH_.
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                    (long)hIndex * 4);
          StuntDouble::getPos((Vector3d *)&local_150,&pHVar4->donorAtom->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_120,&local_150);
          StuntDouble::getPos((Vector3d *)&local_150,&pHVar4->donatedHydrogen->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_168,&local_150);
          Vector<double,_3U>::Vector(&local_90,&local_120);
          Vector<double,_3U>::Vector(&local_a8,&local_168);
          Vector<double,_3U>::Vector(&local_c0,&local_138);
          bVar2 = HBondJump::isHBond(&this->super_HBondJump,(Vector3d *)&local_90,
                                     (Vector3d *)&local_a8,(Vector3d *)&local_c0);
          lVar1 = local_1b8;
          if (bVar2) {
            HBondJump::registerHydrogenBond
                      (&this->super_HBondJump,frame,(int)local_1b8,hIndex,
                       (local_1a8->super_StuntDouble).globalIndex_);
            Vector<double,_3U>::operator=(&local_180,&local_168);
            if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
              Snapshot::wrapVector
                        ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                         (Vector3d *)&local_180);
            }
            *(int *)(*(long *)((long)&local_198->_vptr_Molecule +
                              (long)(this->zbin_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + lVar1 * 4) =
                 (int)(((local_180.data_[(uint)this->axis_] + local_1c0) * (double)this->nZBins_) /
                      *(double *)
                       ((long)local_108.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_ +
                       (ulong)(uint)this->axis_ * 0x20));
          }
          ppHVar7 = ppHVar7 + 1;
          pHVar4 = (HBondDonor *)0x0;
          if (ppHVar7 !=
              (local_1a0->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00135bca:
            pHVar4 = *ppHVar7;
          }
        }
        pMVar5 = SimInfo::nextMolecule
                           ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1c8);
        pMVar3 = local_190;
      }
      local_1d0 = local_1d0 + 1;
      pAVar8 = (Atom *)0x0;
      if (local_1d0 !=
          (pMVar3->hBondAcceptors_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00135c13:
        pAVar8 = *local_1d0;
      }
    }
    pMVar3 = SimInfo::nextMolecule
                       ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1b0);
  }
  return;
}

Assistant:

void HBondJumpZ::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos, pos;
    int hInd, index, aInd, zBin;

    Mat3x3d hmat       = currentSnapshot_->getHmat();
    RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }
    }
  }